

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  Reader file;
  Reader file_00;
  Disposer *pDVar1;
  MallocMessageBuilder *pMVar2;
  ExceptionCallback *pEVar3;
  bool bVar4;
  Maybe<kj::Exception> exception;
  Maybe<kj::Own<capnp::MallocMessageBuilder>_> local_348;
  Fault local_330;
  Fault local_328;
  undefined8 uStack_320;
  SchemaLoader local_318;
  Maybe<kj::Exception> local_2f0;
  Maybe<kj::Exception> local_190;
  
  local_348.ptr.disposer = (Disposer *)0x0;
  local_348.ptr.ptr = (MallocMessageBuilder *)0x0;
  if (changeKind != INCOMPATIBLE) {
    kj::heap<capnp::MallocMessageBuilder>();
    local_348.ptr.disposer = (Disposer *)CONCAT71(local_2f0.ptr._1_7_,local_2f0.ptr.isSet);
    local_348.ptr.ptr = (MallocMessageBuilder *)local_2f0.ptr.field_1.value.ownFile.content.ptr;
  }
  pMVar2 = local_348.ptr.ptr;
  pDVar1 = local_348.ptr.disposer;
  SchemaLoader::SchemaLoader(&local_318);
  file._reader.capTable = file1._reader.capTable;
  file._reader.segment = file1._reader.segment;
  file._reader.data = file1._reader.data;
  file._reader.pointers = file1._reader.pointers;
  file._reader.dataSize = file1._reader.dataSize;
  file._reader.pointerCount = file1._reader.pointerCount;
  file._reader._38_2_ = file1._reader._38_2_;
  file._reader.nestingLimit = file1._reader.nestingLimit;
  file._reader._44_4_ = file1._reader._44_4_;
  loadFile(&local_190,file,&local_318,true,&local_348,sharedOrdinalCount);
  if (local_190.ptr.isSet == true) {
    kj::Exception::~Exception(&local_190.ptr.field_1.value);
  }
  file_00._reader.capTable = file2._reader.capTable;
  file_00._reader.segment = file2._reader.segment;
  file_00._reader.data = file2._reader.data;
  file_00._reader.pointers = file2._reader.pointers;
  file_00._reader.dataSize = file2._reader.dataSize;
  file_00._reader.pointerCount = file2._reader.pointerCount;
  file_00._reader._38_2_ = file2._reader._38_2_;
  file_00._reader.nestingLimit = file2._reader.nestingLimit;
  file_00._reader._44_4_ = file2._reader._44_4_;
  loadFile(&local_2f0,file_00,&local_318,false,&local_348,sharedOrdinalCount);
  bVar4 = true;
  if (changeKind == COMPATIBLE) {
    if (local_2f0.ptr.isSet != true) goto LAB_0014f9d0;
    pEVar3 = kj::getExceptionCallback();
    (*pEVar3->_vptr_ExceptionCallback[3])(pEVar3,&local_2f0.ptr.field_1);
  }
  else {
    if (changeKind != INCOMPATIBLE) {
      if (changeKind != SUBTLY_COMPATIBLE) {
        local_330.exception = (Exception *)0x0;
        local_328.exception = (Exception *)0x0;
        uStack_320 = 0;
        kj::_::Debug::Fault::init
                  (&local_330,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_330);
      }
      goto LAB_0014f9d0;
    }
    if (local_2f0.ptr.isSet == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&local_328,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != nullptr","file1, file2",&file1,&file2);
      kj::_::Debug::Fault::fatal(&local_328);
    }
  }
  bVar4 = false;
LAB_0014f9d0:
  if (local_2f0.ptr.isSet == true) {
    kj::Exception::~Exception(&local_2f0.ptr.field_1.value);
  }
  SchemaLoader::~SchemaLoader(&local_318);
  if (pMVar2 != (MallocMessageBuilder *)0x0) {
    local_348.ptr.ptr = (MallocMessageBuilder *)0x0;
    (**pDVar1->_vptr_Disposer)
              (pDVar1,(code *)((long)(pMVar2->super_MessageBuilder).arenaSpace +
                              (long)((pMVar2->super_MessageBuilder)._vptr_MessageBuilder[-2] + -8)))
    ;
  }
  return bVar4;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_MAYBE(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(*e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != nullptr, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}